

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O3

void __thiscall
std::__detail::__variant::
__variant_construct_single<std::__detail::__variant::_Move_ctor_base<false,skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>&,skiwi::String>
          (_Move_ctor_base<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           *__lhs,String *__rhs_mem)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  
  *(undefined8 *)
   &(__lhs->
    super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ).
    super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ._M_u = *(undefined8 *)__rhs_mem;
  psVar1 = (size_type *)
           ((long)&(__lhs->
                   super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                   ).
                   super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                   ._M_u + 0x18);
  *(size_type **)
   ((long)&(__lhs->
           super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ).
           super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ._M_u + 8) = psVar1;
  pcVar3 = (__rhs_mem->value)._M_dataplus._M_p;
  paVar2 = &(__rhs_mem->value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__rhs_mem->value).field_2 + 8);
    *psVar1 = paVar2->_M_allocated_capacity;
    *(undefined8 *)
     ((long)&(__lhs->
             super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ).
             super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ._M_u + 0x20) = uVar4;
  }
  else {
    *(pointer *)
     ((long)&(__lhs->
             super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ).
             super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ._M_u + 8) = pcVar3;
    *(size_type *)
     ((long)&(__lhs->
             super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ).
             super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ._M_u + 0x18) = paVar2->_M_allocated_capacity;
  }
  *(size_type *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ).
           super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ._M_u + 0x10) = (__rhs_mem->value)._M_string_length;
  (__rhs_mem->value)._M_dataplus._M_p = (pointer)paVar2;
  (__rhs_mem->value)._M_string_length = 0;
  (__rhs_mem->value).field_2._M_local_buf[0] = '\0';
  *(uint64_t *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ).
           super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ._M_u + 0x38) = __rhs_mem->scan_index;
  uVar5 = __rhs_mem->pre_scan_index;
  *(undefined8 *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ).
           super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ._M_u + 0x28) = *(undefined8 *)&__rhs_mem->tail_position;
  *(uint64_t *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ).
           super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ._M_u + 0x30) = uVar5;
  psVar1 = (size_type *)
           ((long)&(__lhs->
                   super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                   ).
                   super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                   ._M_u + 0x50);
  *(size_type **)
   ((long)&(__lhs->
           super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ).
           super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ._M_u + 0x40) = psVar1;
  pcVar3 = (__rhs_mem->filename)._M_dataplus._M_p;
  paVar2 = &(__rhs_mem->filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__rhs_mem->filename).field_2 + 8);
    *psVar1 = paVar2->_M_allocated_capacity;
    *(undefined8 *)
     ((long)&(__lhs->
             super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ).
             super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ._M_u + 0x58) = uVar4;
  }
  else {
    *(pointer *)
     ((long)&(__lhs->
             super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ).
             super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ._M_u + 0x40) = pcVar3;
    *(size_type *)
     ((long)&(__lhs->
             super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ).
             super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             ._M_u + 0x50) = paVar2->_M_allocated_capacity;
  }
  *(size_type *)
   ((long)&(__lhs->
           super__Copy_ctor_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ).
           super__Variant_storage_alias<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
           ._M_u + 0x48) = (__rhs_mem->filename)._M_string_length;
  (__rhs_mem->filename)._M_dataplus._M_p = (pointer)paVar2;
  (__rhs_mem->filename)._M_string_length = 0;
  (__rhs_mem->filename).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

String() : line_nr(-1), column_nr(-1), tail_position(false), scan_index(0), pre_scan_index(0) {}